

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I2sAnalyzer.cpp
# Opt level: O0

void __thiscall I2sAnalyzer::SetupForGettingFirstBit(I2sAnalyzer *this)

{
  int iVar1;
  element_type *peVar2;
  I2sAnalyzer *this_local;
  
  peVar2 = std::auto_ptr<I2sAnalyzerSettings>::operator->(&this->mSettings);
  if (peVar2->mDataValidEdge == PosEdge) {
    iVar1 = AnalyzerChannelData::GetBitState();
    if (iVar1 == 1) {
      AnalyzerChannelData::AdvanceToNextEdge();
    }
  }
  else {
    iVar1 = AnalyzerChannelData::GetBitState();
    if (iVar1 == 0) {
      AnalyzerChannelData::AdvanceToNextEdge();
    }
  }
  return;
}

Assistant:

void I2sAnalyzer::SetupForGettingFirstBit()
{
    if( mSettings->mDataValidEdge == AnalyzerEnums::PosEdge )
    {
        // we want to start out low, so the next time we advance, it'll be a rising edge.
        if( mClock->GetBitState() == BIT_HIGH )
            mClock->AdvanceToNextEdge(); // now we're low.
    }
    else
    {
        // we want to start out low, so the next time we advance, it'll be a falling edge.
        if( mClock->GetBitState() == BIT_LOW )
            mClock->AdvanceToNextEdge(); // now we're high.
    }
}